

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlSaveFormatFileTo(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_70;
  PyObject *local_68;
  undefined4 local_5c;
  undefined8 uStack_58;
  int format;
  char *encoding;
  PyObject *pyobj_cur;
  xmlDocPtr cur;
  PyObject *pyobj_buf;
  xmlOutputBufferPtr buf;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOzi:xmlSaveFormatFileTo",&cur,&encoding,&stack0xffffffffffffffa8,
                     &local_5c);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (cur == (xmlDocPtr)&_Py_NoneStruct) {
      local_68 = (PyObject *)0x0;
    }
    else {
      local_68 = (PyObject *)cur->name;
    }
    pyobj_buf = local_68;
    if (encoding == &_Py_NoneStruct) {
      local_70 = (PyObject *)0x0;
    }
    else {
      local_70 = *(PyObject **)(encoding + 0x10);
    }
    pyobj_cur = local_70;
    buf._4_4_ = xmlSaveFormatFileTo(local_68,local_70,uStack_58,local_5c);
    cur->name = (char *)0x0;
    self_local = libxml_intWrap(buf._4_4_);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlSaveFormatFileTo(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlOutputBufferPtr buf;
    PyObject *pyobj_buf;
    xmlDocPtr cur;
    PyObject *pyobj_cur;
    char * encoding;
    int format;

    if (!PyArg_ParseTuple(args, (char *)"OOzi:xmlSaveFormatFileTo", &pyobj_buf, &pyobj_cur, &encoding, &format))
        return(NULL);
    buf = (xmlOutputBufferPtr) PyoutputBuffer_Get(pyobj_buf);
    cur = (xmlDocPtr) PyxmlNode_Get(pyobj_cur);

    c_retval = xmlSaveFormatFileTo(buf, cur, encoding, format);
	/* xmlSaveFormatFileTo() freed the memory pointed to by buf, so record that
	 * in the Python object */
	((PyoutputBuffer_Object *)(pyobj_buf))->obj = NULL;
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}